

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int ssl_bitmask_check(uchar *mask,size_t len)

{
  ulong local_28;
  size_t i;
  size_t len_local;
  uchar *mask_local;
  
  for (local_28 = 0; local_28 < len >> 3; local_28 = local_28 + 1) {
    if (mask[local_28] != 0xff) {
      return -1;
    }
  }
  local_28 = 0;
  while( true ) {
    if ((len & 7) <= local_28) {
      return 0;
    }
    if (((uint)mask[len >> 3] & 1 << (7U - (char)local_28 & 0x1f)) == 0) break;
    local_28 = local_28 + 1;
  }
  return -1;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_bitmask_check(unsigned char *mask, size_t len)
{
    size_t i;

    for (i = 0; i < len / 8; i++) {
        if (mask[i] != 0xFF) {
            return -1;
        }
    }

    for (i = 0; i < len % 8; i++) {
        if ((mask[len / 8] & (1 << (7 - i))) == 0) {
            return -1;
        }
    }

    return 0;
}